

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *pFVar6;
  FadExpr<FadFuncCos<Fad<double>_>_> *pFVar7;
  FadExpr<FadFuncSin<Fad<double>_>_> *pFVar8;
  double *pdVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  pFVar6 = (this->left_->fadexpr_).right_;
  pFVar7 = (pFVar6->fadexpr_).right_;
  pdVar9 = &(pFVar7->fadexpr_).expr_.defaultVal;
  if ((pFVar7->fadexpr_).expr_.dx_.num_elts != 0) {
    pdVar9 = (pFVar7->fadexpr_).expr_.dx_.ptr_to_data + i;
  }
  dVar1 = *pdVar9;
  dVar10 = sin((pFVar7->fadexpr_).expr_.val_);
  dVar2 = (pFVar6->fadexpr_).left_.constant_;
  dVar11 = sin((this->right_->fadexpr_).expr_.val_);
  pFVar8 = this->right_;
  pdVar9 = &(pFVar8->fadexpr_).expr_.defaultVal;
  if ((pFVar8->fadexpr_).expr_.dx_.num_elts != 0) {
    pdVar9 = (pFVar8->fadexpr_).expr_.dx_.ptr_to_data + i;
  }
  dVar3 = *pdVar9;
  dVar12 = cos((pFVar8->fadexpr_).expr_.val_);
  dVar4 = (this->left_->fadexpr_).left_.constant_;
  pFVar6 = (this->left_->fadexpr_).right_;
  dVar5 = (pFVar6->fadexpr_).left_.constant_;
  dVar13 = cos((((pFVar6->fadexpr_).right_)->fadexpr_).expr_.val_);
  return (dVar13 * dVar5 + dVar4) * dVar12 * dVar3 - dVar11 * dVar10 * dVar1 * dVar2;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}